

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_parser.cpp
# Opt level: O2

bool __thiscall
Iso9660Parser::read_sectors_raw(Iso9660Parser *this,void *buf,int isosec,int numsects,bool decrypt)

{
  size_t sVar1;
  size_t __n;
  
  fseek((FILE *)this->f,(long)this->sectorSize * ((long)isosec + (long)this->isoStartSector),0);
  __n = (size_t)numsects;
  sVar1 = fread(buf,(long)this->sectorSize,__n,(FILE *)this->f);
  if (sVar1 == __n) {
    if ((decrypt) && (this->key != (uchar *)0x0)) {
      DecryptSectors(buf,(isosec + this->isoZoneSector) - this->isoStartSector,numsects,
                     this->sectorSize,this->key,this->keyLen);
    }
  }
  else {
    printf("read error for sector %d\n",(ulong)(uint)(isosec + this->isoStartSector));
  }
  return sVar1 == __n;
}

Assistant:

bool Iso9660Parser::read_sectors_raw(void* buf, int isosec, int numsects, bool decrypt)
{
  fseek(f, isoToPhysical(isosec)*sectorSize, SEEK_SET);
  if ( fread(buf, sectorSize, numsects, f) != numsects )
  {
    printf("read error for sector %d\n", isoToPhysical(isosec));
    return false;
  }
  if ( decrypt && key != NULL )
    DecryptSectors(buf, isoToLogical(isosec), numsects, sectorSize, key, keyLen);
  return true;
}